

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jessilib::json_parser::serialize_impl<char8_t,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,json_parser *this,object *in_object)

{
  object *in_object_local;
  json_parser *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  serialize_impl<char8_t,char>(this,__return_storage_ptr__,in_object);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<ResultCharT> serialize_impl(const object& in_object) {
		std::basic_string<ResultCharT> result;
		serialize_impl<CharT, ResultCharT>(result, in_object);
		return result;
	}